

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdn.c
# Opt level: O1

void Qiniu_Free_CDNLogListRet(Qiniu_CDN_LogListRet *ret)

{
  long lVar1;
  long lVar2;
  
  if (ret->data != (_Qiniu_CDN_LogListData *)0x0) {
    if (0 < ret->domainsCount) {
      lVar1 = 0x10;
      lVar2 = 0;
      do {
        if (0 < *(int *)((long)ret->data + lVar1 + -8)) {
          Qiniu_Free(*(void **)((long)&ret->data->domain + lVar1));
        }
        lVar2 = lVar2 + 1;
        lVar1 = lVar1 + 0x18;
      } while (lVar2 < ret->domainsCount);
    }
    Qiniu_Free(ret->data);
    return;
  }
  return;
}

Assistant:

void Qiniu_Free_CDNLogListRet(Qiniu_CDN_LogListRet *ret) {
    int i;
    if (ret->data != NULL) {
        for (i = 0; i < ret->domainsCount; i++) {
            if (ret->data[i].itemsCount > 0) {
                Qiniu_Free(ret->data[i].items);
            }
        }
        Qiniu_Free(ret->data);
    }
}